

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::MemoryImport::~MemoryImport(MemoryImport *this)

{
  MemoryImport *this_local;
  
  (this->super_ImportMixin<(wabt::ExternalKind)2>).super_Import._vptr_Import =
       (_func_int **)&PTR__MemoryImport_003c1368;
  Memory::~Memory(&this->memory);
  ImportMixin<(wabt::ExternalKind)2>::~ImportMixin(&this->super_ImportMixin<(wabt::ExternalKind)2>);
  return;
}

Assistant:

explicit MemoryImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Memory>(), memory(name) {}